

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O1

void __thiscall
Imf_3_2::DeepScanLineInputFile::DeepScanLineInputFile
          (DeepScanLineInputFile *this,Header *header,IStream *is,int version,int numThreads)

{
  int iVar1;
  Data *pDVar2;
  InputStreamMutex *pIVar3;
  
  GenericInputFile::GenericInputFile(&this->super_GenericInputFile);
  (this->super_GenericInputFile)._vptr_GenericInputFile =
       (_func_int **)&PTR__DeepScanLineInputFile_003d73c0;
  pDVar2 = (Data *)operator_new(0x208);
  Data::Data(pDVar2,numThreads);
  this->_data = pDVar2;
  pIVar3 = (InputStreamMutex *)operator_new(0x38);
  (pIVar3->super_mutex).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  pIVar3->is = (IStream *)0x0;
  *(undefined8 *)((long)&(pIVar3->super_mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (pIVar3->super_mutex).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (pIVar3->super_mutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(pIVar3->super_mutex).super___mutex_base._M_mutex + 8) = 0;
  pIVar3->currentPosition = 0;
  pDVar2->_streamData = pIVar3;
  pDVar2->_deleteStream = false;
  pIVar3->is = is;
  iVar1 = (*is->_vptr_IStream[2])(is);
  pDVar2 = this->_data;
  pDVar2->memoryMapped = SUB41(iVar1,0);
  pDVar2->version = version;
  initialize(this,header);
  pDVar2 = this->_data;
  anon_unknown_0::readLineOffsets
            (pDVar2->_streamData->is,pDVar2->lineOrder,&pDVar2->lineOffsets,&pDVar2->fileIsComplete)
  ;
  return;
}

Assistant:

DeepScanLineInputFile::DeepScanLineInputFile (
    const Header&                            header,
    OPENEXR_IMF_INTERNAL_NAMESPACE::IStream* is,
    int                                      version,
    int                                      numThreads)
    : _data (new Data (numThreads))
{
    _data->_streamData     = new InputStreamMutex ();
    _data->_deleteStream   = false;
    _data->_streamData->is = is;

    _data->memoryMapped = is->isMemoryMapped ();

    _data->version = version;

    try
    {
        initialize (header);
    }
    catch (...)
    {
        if (_data && _data->_streamData) { delete _data->_streamData; }
        if (_data) delete _data;

        throw;
    }

    readLineOffsets (
        *_data->_streamData->is,
        _data->lineOrder,
        _data->lineOffsets,
        _data->fileIsComplete);
}